

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::Triple(Triple *this,Twine *ArchStr,Twine *VendorStr,Twine *OSStr)

{
  undefined1 auVar1 [16];
  ArchType AVar2;
  SubArchType SVar3;
  VendorType VVar4;
  OSType OVar5;
  ObjectFormatType OVar6;
  undefined8 uVar7;
  char *pcVar8;
  size_t sVar9;
  string local_1b8;
  StringRef local_198;
  string local_188;
  StringRef local_168;
  string local_158;
  StringRef local_138;
  undefined1 local_128 [48];
  Twine local_f8;
  Twine local_e0;
  Twine local_c8;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine *local_68;
  Twine *OSStr_local;
  Twine *VendorStr_local;
  Twine *ArchStr_local;
  Triple *this_local;
  undefined1 *local_40;
  string *local_38;
  StringRef *local_30;
  string *local_28;
  StringRef *local_20;
  string *local_18;
  StringRef *local_10;
  
  local_68 = OSStr;
  OSStr_local = VendorStr;
  VendorStr_local = ArchStr;
  ArchStr_local = (Twine *)this;
  Twine::Twine(&local_e0,'-');
  llvm::operator+(&local_c8,ArchStr,&local_e0);
  llvm::operator+(&local_b0,&local_c8,OSStr_local);
  Twine::Twine(&local_f8,'-');
  llvm::operator+(&local_98,&local_b0,&local_f8);
  llvm::operator+(&local_80,&local_98,local_68);
  Twine::str_abi_cxx11_(&this->Data,&local_80);
  Twine::str_abi_cxx11_((string *)local_128,VendorStr_local);
  local_40 = local_128 + 0x20;
  this_local = (Triple *)local_128;
  uVar7 = std::__cxx11::string::data();
  auVar1 = local_128._32_16_;
  local_128._32_4_ = (ArchType)uVar7;
  local_128._36_4_ = SUB84(uVar7,4);
  local_128._32_16_ = auVar1;
  uVar7 = std::__cxx11::string::length();
  auVar1 = local_128._32_16_;
  local_128._40_4_ = (VendorType)uVar7;
  local_128._44_4_ = SUB84(uVar7,4);
  local_128._32_16_ = auVar1;
  AVar2 = parseArch((StringRef)local_128._32_16_);
  std::__cxx11::string::~string((string *)local_128);
  this->Arch = AVar2;
  Twine::str_abi_cxx11_(&local_158,VendorStr_local);
  local_30 = &local_138;
  local_38 = &local_158;
  pcVar8 = (char *)std::__cxx11::string::data();
  local_138.Data = pcVar8;
  sVar9 = std::__cxx11::string::length();
  local_138.Length = sVar9;
  SVar3 = parseSubArch(local_138);
  std::__cxx11::string::~string((string *)&local_158);
  this->SubArch = SVar3;
  Twine::str_abi_cxx11_(&local_188,OSStr_local);
  local_20 = &local_168;
  local_28 = &local_188;
  pcVar8 = (char *)std::__cxx11::string::data();
  local_168.Data = pcVar8;
  sVar9 = std::__cxx11::string::length();
  local_168.Length = sVar9;
  VVar4 = parseVendor(local_168);
  std::__cxx11::string::~string((string *)&local_188);
  this->Vendor = VVar4;
  Twine::str_abi_cxx11_(&local_1b8,local_68);
  local_10 = &local_198;
  local_18 = &local_1b8;
  pcVar8 = (char *)std::__cxx11::string::data();
  local_198.Data = pcVar8;
  sVar9 = std::__cxx11::string::length();
  local_198.Length = sVar9;
  OVar5 = parseOS(local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  this->OS = OVar5;
  this->Environment = UnknownEnvironment;
  this->ObjectFormat = UnknownObjectFormat;
  OVar6 = getDefaultFormat(this);
  this->ObjectFormat = OVar6;
  return;
}

Assistant:

Triple::Triple(const Twine &ArchStr, const Twine &VendorStr, const Twine &OSStr)
    : Data((ArchStr + Twine('-') + VendorStr + Twine('-') + OSStr).str()),
      Arch(parseArch(ArchStr.str())),
      SubArch(parseSubArch(ArchStr.str())),
      Vendor(parseVendor(VendorStr.str())),
      OS(parseOS(OSStr.str())),
      Environment(), ObjectFormat(Triple::UnknownObjectFormat) {
  ObjectFormat = getDefaultFormat(*this);
}